

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O0

MPP_RET hal_h264e_vepu540c_init(void *hal,MppEncHalCfg *cfg)

{
  MppEncCfgSet *pMVar1;
  void *pvVar2;
  MppEncHwCfg *hw;
  MPP_RET ret;
  HalH264eVepu540cCtx *p;
  MppEncHalCfg *cfg_local;
  void *hal_local;
  
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","enter %p\n","hal_h264e_vepu540c_init",hal);
  }
  *(MppEncCfgSet **)hal = cfg->cfg;
  cfg->type = VPU_CLIENT_RKVENC;
  hw._4_4_ = mpp_dev_init(&cfg->dev,cfg->type);
  if (hw._4_4_ == MPP_OK) {
    *(MppDev *)((long)hal + 8) = cfg->dev;
    hw._4_4_ = hal_bufs_init((HalBufs *)((long)hal + 0x18));
    if (hw._4_4_ == MPP_OK) {
      pMVar1 = cfg->cfg;
      (pMVar1->hw).qp_delta_row_i = 1;
      (pMVar1->hw).qp_delta_row = 2;
      (pMVar1->hw).qbias_i = 0x2ab;
      (pMVar1->hw).qbias_p = 0x155;
      (pMVar1->hw).qbias_en = 0;
      memcpy((pMVar1->hw).aq_thrd_i,h264_aq_tthd_default,0x40);
      memcpy((pMVar1->hw).aq_thrd_p,h264_aq_tthd_default,0x40);
      memcpy((pMVar1->hw).aq_step_i,h264_I_aq_step_default,0x40);
      memcpy((pMVar1->hw).aq_step_p,h264_P_aq_step_default,0x40);
      pvVar2 = mpp_osal_calloc("hal_h264e_vepu540c_init",0x15c8);
      *(void **)((long)hal + 0x160) = pvVar2;
      if (*(long *)((long)hal + 0x160) == 0) {
        _mpp_log_l(2,"hal_h264e_vepu540c","HalVepu540cRegSet alloc fail",(char *)0x0);
        return MPP_ERR_MALLOC;
      }
    }
    else {
      _mpp_log_l(2,"hal_h264e_vepu540c","init vepu buffer failed ret: %d\n",
                 "hal_h264e_vepu540c_init",(ulong)(uint)hw._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_h264e_vepu540c","mpp_dev_init failed. ret: %d\n","hal_h264e_vepu540c_init",
               (ulong)(uint)hw._4_4_);
  }
  if (hw._4_4_ != MPP_OK) {
    hal_h264e_vepu540c_deinit(hal);
  }
  h264e_vepu_stream_amend_init((HalH264eVepuStreamAmend *)((long)hal + 0x70));
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","leave %p\n","hal_h264e_vepu540c_init",hal);
  }
  return hw._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu540c_init(void *hal, MppEncHalCfg *cfg)
{
    HalH264eVepu540cCtx *p = (HalH264eVepu540cCtx *)hal;
    MPP_RET ret = MPP_OK;
    hal_h264e_dbg_func("enter %p\n", p);

    p->cfg = cfg->cfg;

    /* update output to MppEnc */
    cfg->type = VPU_CLIENT_RKVENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        goto DONE;
    }
    p->dev = cfg->dev;

    ret = hal_bufs_init(&p->hw_recn);
    if (ret) {
        mpp_err_f("init vepu buffer failed ret: %d\n", ret);
        goto DONE;
    }

    {   /* setup default hardware config */
        MppEncHwCfg *hw = &cfg->cfg->hw;

        hw->qp_delta_row_i  = 1;
        hw->qp_delta_row    = 2;
        hw->qbias_i = 683;
        hw->qbias_p = 341;
        hw->qbias_en = 0;

        memcpy(hw->aq_thrd_i, h264_aq_tthd_default, sizeof(hw->aq_thrd_i));
        memcpy(hw->aq_thrd_p, h264_aq_tthd_default, sizeof(hw->aq_thrd_p));
        memcpy(hw->aq_step_i, h264_I_aq_step_default, sizeof(hw->aq_step_i));
        memcpy(hw->aq_step_p, h264_P_aq_step_default, sizeof(hw->aq_step_p));
    }

    p->regs_set = mpp_calloc(HalVepu540cRegSet, 1);

    if (!p->regs_set) {
        mpp_err("HalVepu540cRegSet alloc fail");
        return MPP_ERR_MALLOC;
    }

DONE:
    if (ret)
        hal_h264e_vepu540c_deinit(hal);

    h264e_vepu_stream_amend_init(&p->amend);

    hal_h264e_dbg_func("leave %p\n", p);
    return ret;
}